

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::ConvertToObserved
          (CECoordinates *this,double jd,double longitude,double latitude,double elevation_m,
          double pressure_hPa,double temperature_celsius,double relative_humidity,double dut1,
          double xp,double yp,double wavelength_um)

{
  undefined8 uVar1;
  double *in_RSI;
  CECoordinates *in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double *unaff_retaddr;
  double *in_stack_00000008;
  CEAngle *in_stack_00000010;
  CECoordinateType *in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double *in_stack_00000038;
  double *in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  double in_stack_00000060;
  double in_stack_00000068;
  double in_stack_00000070;
  double in_stack_00000078;
  double in_stack_00000080;
  string msg;
  double apparent_hourangle;
  double apparent_y;
  double apparent_x;
  double ycoord_new;
  double xcoord_new;
  CEAngle *in_stack_fffffffffffffeb0;
  CEAngle *in_stack_fffffffffffffeb8;
  CECoordinates *in_stack_fffffffffffffec0;
  allocator *paVar2;
  string *in_stack_fffffffffffffee0;
  CECoordinates *pCVar3;
  allocator local_d1;
  double *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  double *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  double *pdVar4;
  double glat;
  double wavelength;
  
  wavelength = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  glat = 0.0;
  pdVar4 = (double *)0x0;
  if (*(int *)(in_RSI + 5) == 0) {
    pdVar4 = in_RSI;
    pCVar3 = in_RDI;
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x38))();
    CIRS2Observed(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                  in_stack_00000030,in_stack_00000028,in_stack_00000020,(double)in_stack_00000018,
                  (double)in_stack_00000010,(double)in_stack_00000008,in_stack_00000060,
                  in_stack_00000068,in_stack_00000070,in_stack_00000078,in_stack_00000080,
                  unaff_retaddr,(double *)pCVar3,pdVar4);
  }
  else if (*(int *)(in_RSI + 5) == 1) {
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x38))();
    ICRS2Observed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                  in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                  (double)in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58,
                  (double)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(double)pdVar4,glat,
                  in_XMM7_Qa,in_XMM6_Qa,in_XMM5_Qa,in_stack_ffffffffffffff40,
                  in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  }
  else {
    if (*(int *)(in_RSI + 5) != 2) {
      pCVar3 = in_RDI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff68,"[ERROR] ",(allocator *)&stack0xffffffffffffff67
                );
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
      if (*(int *)(in_RSI + 5) == 3) {
        std::__cxx11::string::operator+=
                  ((string *)&stack0xffffffffffffff68,"Unable to convert to OBSERVED from OBSERVED")
        ;
      }
      uVar1 = __cxa_allocate_exception(0xa8);
      paVar2 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff30,"CECoordinates::ConvertToObserved(long form)",
                 paVar2);
      CEException::invalid_value::invalid_value
                ((invalid_value *)pCVar3,(string *)in_RDI,in_stack_fffffffffffffee0);
      __cxa_throw(uVar1,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x38))();
    Galactic2Observed(in_XMM7_Qa,glat,pdVar4,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80,
                      (double)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                      in_stack_ffffffffffffff68,in_XMM5_Qa,in_XMM4_Qa,in_XMM3_Qa,in_XMM2_Qa,
                      wavelength,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      in_stack_ffffffffffffff50);
  }
  CEAngle::CEAngle(in_stack_00000010,in_stack_00000008);
  CEAngle::CEAngle(in_stack_00000010,in_stack_00000008);
  CECoordinates(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                in_stack_00000018);
  CEAngle::~CEAngle((CEAngle *)0x15073d);
  CEAngle::~CEAngle((CEAngle *)0x15074a);
  return in_RDI;
}

Assistant:

CECoordinates CECoordinates::ConvertToObserved(double jd,
                                double longitude,
                                double latitude,
                                double elevation_m,
                                double pressure_hPa,
                                double temperature_celsius,
                                double relative_humidity,
                                double dut1,
                                double xp, double yp,
                                double wavelength_um)
{
    double xcoord_new(0.0);
    double ycoord_new(0.0);
    double apparent_x, apparent_y, apparent_hourangle;
    if (coord_type_ == CECoordinateType::CIRS) {
        CIRS2Observed(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd,
                      longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius,
                      relative_humidity,
                      dut1, xp, yp,
                      wavelength_um,
                      &apparent_x, &apparent_y, &apparent_hourangle) ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        ICRS2Observed(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd,
                      longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius,
                      relative_humidity,
                      dut1, xp, yp,
                      wavelength_um,
                      &apparent_x, &apparent_y, &apparent_hourangle) ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        Galactic2Observed(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd,
                      longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius,
                      relative_humidity,
                      dut1, xp, yp,
                      wavelength_um,
                      &apparent_x, &apparent_y, &apparent_hourangle) ;
    } else {
        // Throw an exception
        std::string msg = "[ERROR] ";
        if (coord_type_ == CECoordinateType::OBSERVED) {
            // Cant convert from observed to observed without additional
            // observer information
            msg += "Unable to convert to OBSERVED from OBSERVED";
        }
        throw CEException::invalid_value("CECoordinates::ConvertToObserved(long form)",
                                         msg);
    }
 
    return CECoordinates(xcoord_new, ycoord_new, CECoordinateType::OBSERVED) ;
}